

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isPossibleParameter(TokenKind kind)

{
  TokenKind in_DI;
  bool local_1;
  
  if ((((in_DI == Comma) || (in_DI == LocalParamKeyword)) || (in_DI == ParameterKeyword)) ||
     (in_DI == TypeKeyword)) {
    local_1 = true;
  }
  else {
    local_1 = isPossibleDataType(in_DI);
  }
  return local_1;
}

Assistant:

bool SyntaxFacts::isPossibleParameter(TokenKind kind) {
    switch (kind) {
        case TokenKind::ParameterKeyword:
        case TokenKind::LocalParamKeyword:
        case TokenKind::TypeKeyword:
        case TokenKind::Comma:
            return true;
        default:
            return isPossibleDataType(kind);
    }
}